

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteInt64
               (int field_number,int64_t value,CodedOutputStream *output)

{
  bool bVar1;
  byte *pbVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  byte *ptr;
  ulong uVar7;
  
  uVar6 = field_number << 3;
  pbVar2 = output->cur_;
  if ((output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar2);
  }
  output->cur_ = pbVar2;
  *pbVar2 = (byte)uVar6;
  if (uVar6 < 0x80) {
    ptr = pbVar2 + 1;
  }
  else {
    *pbVar2 = (byte)uVar6 | 0x80;
    pbVar2[1] = (byte)(uVar6 >> 7);
    ptr = pbVar2 + 2;
    if (0x3fff < uVar6) {
      uVar4 = (uint)pbVar2[1];
      uVar6 = uVar6 >> 7;
      do {
        ptr[-1] = (byte)uVar4 | 0x80;
        uVar4 = uVar6 >> 7;
        *ptr = (byte)uVar4;
        ptr = ptr + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar4;
      } while (bVar1);
    }
  }
  output->cur_ = ptr;
  if ((output->impl_).end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,ptr);
  }
  output->cur_ = ptr;
  *ptr = (byte)value;
  if ((ulong)value < 0x80) {
    pbVar2 = ptr + 1;
  }
  else {
    *ptr = (byte)value | 0x80;
    ptr[1] = (byte)((ulong)value >> 7);
    pbVar2 = ptr + 2;
    if (0x3fff < (ulong)value) {
      uVar7 = (ulong)ptr[1];
      uVar5 = (ulong)value >> 7;
      do {
        pbVar2[-1] = (byte)uVar7 | 0x80;
        uVar3 = uVar5 >> 7;
        *pbVar2 = (byte)uVar3;
        pbVar2 = pbVar2 + 1;
        uVar7 = uVar3 & 0xffffffff;
        bVar1 = 0x3fff < uVar5;
        uVar5 = uVar3;
      } while (bVar1);
    }
  }
  output->cur_ = pbVar2;
  return;
}

Assistant:

void WireFormatLite::WriteInt64(int field_number, int64_t value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteInt64NoTag(value, output);
}